

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportTable
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  undefined1 local_158 [16];
  string local_148;
  allocator<char> local_121;
  string local_120;
  ImportType local_100;
  uint64_t local_b8;
  uint64_t local_b0;
  undefined8 local_a8;
  Type local_a0;
  undefined1 local_98 [8];
  TableType table_type;
  Location local_60;
  Enum local_40;
  Index local_3c;
  BinaryReaderInterp *pBStack_38;
  Index import_index_local;
  BinaryReaderInterp *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderInterp *)field_name._M_len;
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  local_3c = import_index;
  pBStack_38 = this;
  GetLocation(&local_60,this);
  table_type.limits._16_8_ = elem_type;
  local_40 = (Enum)SharedValidator::OnTable(&this->validator_,&local_60,elem_type,elem_limits);
  bVar2 = Failed((Result)local_40);
  if (bVar2) {
    Result::Result((Result *)((long)&module_name_local._M_str + 4),Error);
  }
  else {
    local_a0 = elem_type;
    local_b8 = elem_limits->initial;
    local_b0 = elem_limits->max;
    local_a8._0_1_ = elem_limits->has_max;
    local_a8._1_1_ = elem_limits->is_shared;
    local_a8._2_1_ = elem_limits->is_64;
    local_a8._3_5_ = *(undefined5 *)&elem_limits->field_0x13;
    TableType::TableType((TableType *)local_98,elem_type,*elem_limits);
    pMVar1 = this->module_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_120,
               (basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str,
               &local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_148,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
               (allocator<char> *)(local_158 + 0xf));
    TableType::Clone((TableType *)local_158);
    ImportType::ImportType
              (&local_100,&local_120,&local_148,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)local_158);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::push_back
              (&pMVar1->imports,(value_type *)&local_100);
    ImportDesc::~ImportDesc((ImportDesc *)&local_100);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 *)local_158);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)(local_158 + 0xf));
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::push_back
              (&this->table_types_,(value_type *)local_98);
    Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
    TableType::~TableType((TableType *)local_98);
  }
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnImportTable(Index import_index,
                                         std::string_view module_name,
                                         std::string_view field_name,
                                         Index table_index,
                                         Type elem_type,
                                         const Limits* elem_limits) {
  CHECK_RESULT(validator_.OnTable(GetLocation(), elem_type, *elem_limits));
  TableType table_type{elem_type, *elem_limits};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), table_type.Clone())});
  table_types_.push_back(table_type);
  return Result::Ok;
}